

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O2

SharedPtr<FontEffect> __thiscall
Rml::FontEffectGlowInstancer::InstanceFontEffect
          (FontEffectGlowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  FontEffectGlowInstancer *pFVar2;
  bool bVar3;
  int _width_outline;
  int _width_blur;
  int iVar4;
  int iVar5;
  Colour<unsigned_char,_255,_false> _colour;
  Property *pPVar6;
  PropertyDictionary *in_RCX;
  Vector2i _offset;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<FontEffect> SVar7;
  SharedPtr<Rml::FontEffectGlow> font_effect;
  FontEffectGlow *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  FontEffectGlowInstancer *local_38;
  
  local_38 = this;
  pPVar6 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[0]);
  _width_outline = Property::Get<int>(pPVar6);
  pPVar6 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[1]);
  _width_blur = Property::Get<int>(pPVar6);
  pPVar6 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[2]);
  iVar4 = Property::Get<int>(pPVar6);
  pPVar6 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[3]);
  iVar5 = Property::Get<int>(pPVar6);
  pPVar6 = PropertyDictionary::GetProperty(in_RCX,param_1[4].field_2._M_local_buf[4]);
  _colour = Property::Get<Rml::Colour<unsigned_char,255,false>>(pPVar6);
  if (_width_blur < 0) {
    _width_blur = _width_outline;
  }
  ::std::make_shared<Rml::FontEffectGlow>();
  _offset.y = iVar5;
  _offset.x = iVar4;
  bVar3 = FontEffectGlow::Initialise(local_48,_width_outline,_width_blur,_offset);
  if (bVar3) {
    FontEffect::SetColour(&local_48->super_FontEffect,_colour);
    _Var1._M_pi = _Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_38->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)local_48;
    (local_38->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var1._M_pi;
  }
  else {
    (local_38->super_FontEffectInstancer)._vptr_FontEffectInstancer = (_func_int **)0x0;
    (local_38->super_FontEffectInstancer).properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  pFVar2 = local_38;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  SVar7.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar7.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pFVar2;
  return (SharedPtr<FontEffect>)
         SVar7.super___shared_ptr<Rml::FontEffect,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<FontEffect> FontEffectGlowInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	Vector2i offset;
	int width_outline = properties.GetProperty(id_width_outline)->Get<int>();
	int width_blur = properties.GetProperty(id_width_blur)->Get<int>();
	offset.x = properties.GetProperty(id_offset_x)->Get<int>();
	offset.y = properties.GetProperty(id_offset_y)->Get<int>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	if (width_blur < 0)
		width_blur = width_outline;

	auto font_effect = MakeShared<FontEffectGlow>();
	if (font_effect->Initialise(width_outline, width_blur, offset))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}